

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_class_equip(parser *p)

{
  int iVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  parser_error pVar6;
  void *pvVar7;
  char *pcVar8;
  char *s;
  char *__s1;
  void *p_00;
  wchar_t *p_01;
  long lVar9;
  wchar_t result;
  int iVar10;
  int iVar11;
  
  pvVar7 = parser_priv(p);
  if (pvVar7 == (void *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar8 = parser_getsym(p,"tval");
    wVar3 = tval_find_idx(pcVar8);
    if (wVar3 < L'\0') {
      pVar6 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      pcVar8 = parser_getsym(p,"sval");
      wVar4 = lookup_sval(wVar3,pcVar8);
      if (wVar4 < L'\0') {
        pVar6 = PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      else {
        pcVar8 = parser_getsym(p,"eopts");
        pcVar8 = string_make(pcVar8);
        s = strtok(pcVar8," |");
        if (s == (char *)0x0) {
          p_00 = (void *)0x0;
        }
        else {
          iVar1 = 0;
          iVar11 = 0;
          p_00 = (void *)0x0;
          do {
            _Var2 = prefix(s,"NOT-");
            iVar10 = 1;
            do {
              __s1 = option_name(iVar10);
              iVar5 = strcmp(__s1,s + (ulong)_Var2 * 4);
              if (iVar5 == 0) {
                iVar5 = option_type(iVar10);
                if (iVar5 == 1) {
                  iVar5 = iVar1;
                  if (iVar1 + -2 <= iVar11) {
                    iVar5 = iVar1 * 2;
                    if (iVar1 == 0) {
                      iVar5 = 2;
                    }
                    p_00 = mem_realloc(p_00,(long)iVar5 << 2);
                  }
                  iVar1 = -iVar10;
                  if (!_Var2) {
                    iVar1 = iVar10;
                  }
                  lVar9 = (long)iVar11;
                  *(int *)((long)p_00 + lVar9 * 4) = iVar1;
                  iVar11 = iVar11 + 1;
                  *(undefined4 *)((long)p_00 + lVar9 * 4 + 4) = 0;
                  iVar1 = iVar5;
                  goto LAB_00160569;
                }
                break;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != 0x2d);
            iVar10 = strcmp(s + (ulong)_Var2 * 4,"none");
            if (iVar10 != 0) {
              mem_free(p_00);
              string_free(pcVar8);
              return PARSE_ERROR_INVALID_OPTION;
            }
LAB_00160569:
            s = strtok((char *)0x0," |");
          } while (s != (char *)0x0);
        }
        string_free(pcVar8);
        p_01 = (wchar_t *)mem_zalloc(0x20);
        *p_01 = wVar3;
        p_01[1] = wVar4;
        wVar3 = parser_getuint(p,"min");
        p_01[2] = wVar3;
        wVar3 = parser_getuint(p,"max");
        p_01[3] = wVar3;
        *(void **)(p_01 + 4) = p_00;
        if (wVar3 < L'd' && p_01[2] < L'd') {
          *(undefined8 *)(p_01 + 6) = *(undefined8 *)((long)pvVar7 + 0xe8);
          *(wchar_t **)((long)pvVar7 + 0xe8) = p_01;
          pVar6 = PARSE_ERROR_NONE;
        }
        else {
          mem_free(p_00);
          mem_free(p_01);
          pVar6 = PARSE_ERROR_INVALID_ITEM_NUMBER;
        }
      }
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_class_equip(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct start_item *si;
	int tval, sval;
	char *eopts;
	char *s;
	int *einds;
	int nind, nalloc;

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	sval = lookup_sval(tval, parser_getsym(p, "sval"));
	if (sval < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	eopts = string_make(parser_getsym(p, "eopts"));
	einds = NULL;
	nind = 0;
	nalloc = 0;
	s = strtok(eopts, " |");
	while (s) {
		bool negated = false;
		int ind;

		if (prefix(s, "NOT-")) {
			negated = true;
			s += 4;
		}
		ind = lookup_option(s);
		if (ind > 0 && option_type(ind) == OP_BIRTH) {
			if (nind >= nalloc - 2) {
				if (nalloc == 0) {
					nalloc = 2;
				} else {
					nalloc *= 2;
				}
				einds = mem_realloc(einds,
					nalloc * sizeof(*einds));
			}
			einds[nind] = (negated) ? -ind : ind;
			einds[nind + 1] = 0;
			++nind;
		} else if (!streq(s, "none")) {
			mem_free(einds);
			string_free(eopts);
			return PARSE_ERROR_INVALID_OPTION;
		}
		s = strtok(NULL, " |");
	}
	string_free(eopts);

	si = mem_zalloc(sizeof *si);
	si->tval = tval;
	si->sval = sval;
	si->min = parser_getuint(p, "min");
	si->max = parser_getuint(p, "max");
	si->eopts = einds;

	if (si->min > 99 || si->max > 99) {
		mem_free(si->eopts);
		mem_free(si);
		return PARSE_ERROR_INVALID_ITEM_NUMBER;
	}

	si->next = c->start_items;
	c->start_items = si;

	return PARSE_ERROR_NONE;
}